

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thanm.c
# Opt level: O2

int main(int argc,char **argv)

{
  ushort uVar1;
  anm_script_t *script;
  thanm_instr_t *instr;
  undefined8 *puVar2;
  ushort uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint32_t uVar8;
  long lVar9;
  FILE *pFVar10;
  anm_archive_t *data;
  ulong uVar11;
  byte *png;
  byte *pbVar12;
  size_t sVar13;
  void *pvVar14;
  char *pcVar15;
  FILE *pFVar16;
  int *piVar17;
  char *pcVar18;
  list_node_t *plVar19;
  uint16_t *data_00;
  label_t *plVar20;
  ushort uVar21;
  byte *pbVar22;
  anm_entry_t *paVar23;
  anm_entry_t **ppaVar24;
  list_node_t *plVar25;
  undefined1 *puVar26;
  byte bVar27;
  uint uVar28;
  char *pcVar29;
  char *__format;
  long *plVar30;
  long lVar31;
  long *plVar32;
  stringref_t ref;
  FILE *local_160;
  anm_archive_t *local_148;
  int ind;
  list_node_t *local_138;
  thanm_instr_t *local_130;
  list_node_t *local_128;
  list_t *local_120;
  long *local_118;
  list_t *local_110;
  list_t anms;
  ushort local_f6;
  ushort uStack_f2;
  undefined8 local_f4;
  list_t local_e8;
  anm_entry_t *local_d8;
  anm_script_t *paStack_d0;
  list_t local_c8;
  list_t local_b8;
  list_t local_a8;
  undefined1 local_98 [24];
  char local_80;
  FILE *local_60;
  uint local_58;
  anm_entry_t *tmp;
  char commands [21];
  
  g_anmmap = anmmap_new();
  atexit(free_globals);
  builtin_strncpy(commands,":l:om:x:X:r:c:s:Vfuv",0x15);
  argv0 = util_shortname(*argv);
  ind = 0;
  uVar11 = 0;
  local_160 = (FILE *)0x0;
  iVar7 = -1;
LAB_0010a5f1:
  iVar4 = ind;
  if (argv[util_optind] != (char *)0x0) {
    iVar4 = util_getopt(argc,argv,commands);
    switch(iVar4) {
    case 99:
      if (option_print_offsets == 0) goto switchD_0010a62a_caseD_6c;
      break;
    case 100:
    case 0x65:
    case 0x67:
    case 0x68:
    case 0x69:
    case 0x6a:
    case 0x6b:
    case 0x6e:
    case 0x70:
    case 0x71:
    case 0x74:
    case 0x77:
switchD_0010a62a_caseD_64:
      util_getopt_default(&ind,argv,iVar4,print_usage);
      goto LAB_0010a5f1;
    case 0x66:
      option_force = 1;
      goto LAB_0010a5f1;
    case 0x6c:
    case 0x72:
    case 0x78:
      goto switchD_0010a62a_caseD_6c;
    case 0x6d:
      pFVar16 = fopen(util_optarg,"r");
      pFVar10 = _stderr;
      pcVar15 = argv0;
      if (pFVar16 == (FILE *)0x0) {
        local_130 = (thanm_instr_t *)util_optarg;
        piVar17 = __errno_location();
        pcVar29 = strerror(*piVar17);
        fprintf(pFVar10,"%s: couldn\'t open %s for reading: %s\n",pcVar15,local_130,pcVar29);
      }
      else {
        anmmap_load(g_anmmap,(FILE *)pFVar16,util_optarg);
        fclose(pFVar16);
      }
      goto LAB_0010a5f1;
    case 0x6f:
      if (iVar7 != 99) {
        option_print_offsets = 1;
        goto LAB_0010a5f1;
      }
      break;
    case 0x73:
      local_160 = fopen(util_optarg,"w");
      pFVar10 = _stderr;
      pcVar29 = util_optarg;
      pcVar15 = argv0;
      if (local_160 == (FILE *)0x0) {
        piVar17 = __errno_location();
        pcVar18 = strerror(*piVar17);
        fprintf(pFVar10,"%s: couldn\'t open %s for writing: %s\n",pcVar15,pcVar29,pcVar18);
        local_160 = (FILE *)0x0;
      }
      goto LAB_0010a5f1;
    case 0x75:
      if (option_unique_filenames == 0) {
        option_unique_filenames = 1;
      }
      else {
        option_dont_add_offset_border = 1;
      }
      goto LAB_0010a5f1;
    case 0x76:
      goto switchD_0010a62a_caseD_76;
    default:
      if (iVar4 != 0x58) goto switchD_0010a62a_caseD_64;
switchD_0010a62a_caseD_6c:
      if (iVar7 != -1) {
        fprintf(_stderr,"%s: More than one mode specified\n",argv0);
        goto LAB_0010a913;
      }
      uVar5 = parse_version(util_optarg);
      uVar11 = (ulong)uVar5;
      iVar7 = iVar4;
      goto LAB_0010a5f1;
    }
    pcVar29 = "%s: \'o\' option can\'t be used when creating ANM archive\n";
    pcVar15 = argv0;
    goto LAB_0010a8e2;
  }
  lVar9 = (long)ind;
  argv[lVar9] = (char *)0x0;
  if (iVar7 == -1) goto LAB_0010a913;
  uVar5 = (uint)uVar11;
  pcVar15 = argv0;
  if (uVar5 == 0) {
    pcVar29 = "%s: version must be specified\n";
LAB_0010a8e2:
    fprintf(_stderr,pcVar29,pcVar15);
    goto LAB_0010a8e9;
  }
  if ((0xd < uVar5 - 6) &&
     ((((0x30 < uVar5 - 0x5f || ((0x1000240000101U >> ((ulong)(uVar5 - 0x5f) & 0x3f) & 1) == 0)) &&
       (uVar5 != 0xa5)) && (uVar5 != 0xb9)))) {
    fprintf(_stderr,"%s: version %u is unsupported\n",argv0,uVar11);
    goto LAB_0010a8e9;
  }
  if (iVar7 == 0x58) {
    list_init(&anms);
    if (0 < iVar4) {
      for (lVar31 = 0; lVar9 != lVar31; lVar31 = lVar31 + 1) {
        current_input = argv[lVar31];
        pFVar10 = fopen(current_input,"rb");
        if (pFVar10 == (FILE *)0x0) goto LAB_0010b17d;
        data = anm_read_file((FILE *)pFVar10,uVar5);
        list_append_new(&anms,data);
        fclose(pFVar10);
      }
      plVar19 = (list_node_t *)&anms;
      while (plVar19 = plVar19->next, plVar19 != (list_node_t *)0x0) {
        plVar32 = (long *)((long)plVar19->data + 0x10);
LAB_0010ab50:
        plVar32 = (long *)*plVar32;
        if (plVar32 != (long *)0x0) {
          pcVar15 = (char *)plVar32[2];
          ppaVar24 = &tmp;
          plVar25 = (list_node_t *)&anms;
          while (plVar25 = plVar25->next, plVar25 != (list_node_t *)0x0) {
            plVar30 = (long *)((long)plVar25->data + 0x20);
            while (plVar30 = (long *)*plVar30, plVar30 != (long *)0x0) {
              paVar23 = (anm_entry_t *)plVar30[2];
              pcVar29 = paVar23->name;
              if ((pcVar29 == pcVar15) || (iVar7 = strcmp(pcVar15,pcVar29), iVar7 == 0)) {
                if (paVar23->next_by_name != (anm_entry_t *)0x0) goto LAB_0010ab50;
                *ppaVar24 = paVar23;
                ppaVar24 = &paVar23->next_by_name;
                pcVar15 = pcVar29;
              }
            }
          }
          goto LAB_0010ab50;
        }
      }
      plVar19 = (list_node_t *)&anms;
      lVar9 = 0;
      while (plVar19 = plVar19->next, plVar19 != (list_node_t *)0x0) {
        plVar32 = (long *)((long)plVar19->data + 0x20);
        iVar7 = 0;
        while (plVar32 = (long *)*plVar32, plVar32 != (long *)0x0) {
          paVar23 = (anm_entry_t *)plVar32[2];
          if (paVar23->processed == 0) {
            pcVar15 = paVar23->name;
            current_output = pcVar15;
            if (option_verbose != 0) {
              fprintf(_stderr,"%s\n");
              pcVar15 = paVar23->name;
            }
            if (option_unique_filenames == 0) {
LAB_0010ac3e:
              pcVar29 = (char *)0x0;
            }
            else {
              pcVar15 = anm_make_unique_filename(pcVar15,argv[lVar9],iVar7);
              pcVar29 = pcVar15;
              if (pcVar15 == (char *)0x0) {
                pcVar15 = paVar23->name;
                goto LAB_0010ac3e;
              }
            }
            anm_extract(paVar23,pcVar15,uVar5);
            free(pcVar29);
          }
          iVar7 = iVar7 + 1;
        }
        lVar9 = lVar9 + 1;
      }
      plVar19 = (list_node_t *)&anms;
      while (plVar19 = plVar19->next, plVar19 != (list_node_t *)0x0) {
        anm_free((anm_archive_t *)plVar19->data);
      }
      list_free_nodes(&anms);
      goto LAB_0010b2a8;
    }
  }
  else if (iVar7 == 99) {
    if (ind == 2) {
      pcVar15 = argv[1];
      current_input = pcVar15;
      pFVar16 = fopen(pcVar15,"r");
      pFVar10 = _stderr;
      pcVar29 = argv0;
      if (pFVar16 == (FILE *)0x0) {
        piVar17 = __errno_location();
        pcVar18 = strerror(*piVar17);
        __format = "%s: couldn\'t open %s for reading: %s\n";
LAB_0010aa8f:
        fprintf(pFVar10,__format,pcVar29,pcVar15,pcVar18);
        goto LAB_0010a8e9;
      }
      fgets((char *)&anms,0x80,pFVar16);
      fseek(pFVar16,0,0);
      ref.len = 6;
      ref.str = "ENTRY ";
      iVar7 = util_strcmp_ref((char *)&anms,ref);
      if (iVar7 == 0) {
        local_148 = (anm_archive_t *)0x0;
        fprintf(_stderr,
                "%s: %s: the spec file was made using an old version\nof thanm and uses the old format, which is no longer supported.\nPlease use the old version of thanm to create the ANM file, and\nre-dump it using this version.\n"
                ,argv0,pcVar15);
      }
      else {
        anms.head._0_4_ = 0;
        anms.head._4_2_ = 0;
        anms.tail = (list_node_t *)0xffffffffffffffff;
        uStack_f2 = 0;
        list_init(&local_e8);
        list_init(&local_c8);
        list_init(&local_a8);
        list_init(&local_b8);
        local_d8 = (anm_entry_t *)0x0;
        paStack_d0 = (anm_script_t *)0x0;
        local_60 = local_160;
        local_80 = '\0';
        local_58 = uVar5;
        path_init((path_state_t *)local_98,pcVar15,argv0);
        thanm_yyin = (FILE *)pFVar16;
        iVar7 = thanm_yyparse((parser_state_t *)&anms);
        if (iVar7 == 0 && (int)anms.head == 0) {
          path_free((path_state_t *)local_98);
          local_148 = (anm_archive_t *)util_malloc(0x30);
          local_128 = (list_node_t *)&local_148->names;
          local_148->map = (uchar *)0x0;
          local_148->map_size = 0;
          list_init((list_t *)local_128);
          (local_148->entries).head = local_e8.head;
          (local_148->entries).tail = local_e8.tail;
          local_138 = (list_node_t *)&local_148->entries;
          while (local_138 = local_138->next, local_138 != (list_node_t *)0x0) {
            pvVar14 = local_138->data;
            plVar19 = local_128;
            do {
              plVar19 = plVar19->next;
              if (plVar19 == (list_node_t *)0x0) {
                list_append_new((list_t *)local_128,*(void **)((long)pvVar14 + 0x10));
                goto LAB_0010b615;
              }
              pcVar15 = (char *)plVar19->data;
              pcVar29 = *(char **)((long)pvVar14 + 0x10);
              iVar7 = strcmp(pcVar29,pcVar15);
            } while (iVar7 != 0);
            free(pcVar29);
            *(char **)((long)pvVar14 + 0x10) = pcVar15;
LAB_0010b615:
            plVar32 = (long *)((long)pvVar14 + 0x48);
            while (plVar32 = (long *)*plVar32, plVar32 != (long *)0x0) {
              script = (anm_script_t *)plVar32[2];
              plVar19 = (list_node_t *)&script->instrs;
              local_110 = &script->raw_instrs;
              local_120 = (list_t *)plVar19;
              local_118 = plVar32;
              while (plVar19 = plVar19->next, plVar19 != (list_node_t *)0x0) {
                instr = (thanm_instr_t *)plVar19->data;
                uVar8 = instr_get_size(instr,8);
                data_00 = (uint16_t *)util_malloc((ulong)uVar8);
                *data_00 = instr->id;
                data_00[1] = (short)uVar8 - 8;
                data_00[2] = instr->time;
                data_00[3] = 0;
                plVar25 = (list_node_t *)&instr->params;
                lVar9 = 0;
                bVar27 = 0;
                local_130 = instr;
                while (plVar25 = plVar25->next, plVar25 != (list_node_t *)0x0) {
                  piVar17 = (int *)plVar25->data;
                  if (piVar17[1] != 0) {
                    data_00[3] = data_00[3] | (ushort)(1 << (bVar27 & 0x1f));
                  }
                  iVar7 = *piVar17;
                  switch(iVar7) {
                  case 0x6e:
                    pcVar15 = *(char **)(*(long *)(piVar17 + 4) + 8);
                    plVar20 = (label_t *)symbol_find(&local_b8,pcVar15);
                    if (plVar20 != (label_t *)0x0) goto LAB_0010b7b1;
                    pcVar29 = "%s: sprite not found: %s\n";
LAB_0010b7fe:
                    fprintf(_stderr,pcVar29,argv0,pcVar15);
                    break;
                  case 0x6f:
                    pcVar15 = *(char **)(*(long *)(piVar17 + 4) + 8);
                    plVar20 = label_find(script,pcVar15);
                    if (plVar20 == (label_t *)0x0) {
LAB_0010b7c6:
                      pcVar29 = "%s: label not found: %s\n";
                      goto LAB_0010b7fe;
                    }
LAB_0010b7b1:
                    uVar8 = plVar20->offset;
                    goto LAB_0010b7b3;
                  case 0x70:
                  case 0x71:
                  case 0x72:
                    break;
                  case 0x73:
                    *(undefined2 *)((long)data_00 + lVar9 + 8) =
                         *(undefined2 *)(*(long *)(piVar17 + 4) + 8);
                    lVar9 = lVar9 + 2;
                    break;
                  case 0x74:
                    pcVar15 = *(char **)(*(long *)(piVar17 + 4) + 8);
                    plVar20 = label_find(script,pcVar15);
                    if (plVar20 == (label_t *)0x0) goto LAB_0010b7c6;
                    uVar8 = (uint32_t)plVar20->time;
LAB_0010b7b3:
                    *(uint32_t *)((long)data_00 + lVar9 + 8) = uVar8;
LAB_0010b7bb:
                    lVar9 = lVar9 + 4;
                    break;
                  default:
                    if (iVar7 == 0x4e) {
                      pcVar15 = *(char **)(*(long *)(piVar17 + 4) + 8);
                      plVar20 = (label_t *)symbol_find(&local_a8,pcVar15);
                      if (plVar20 == (label_t *)0x0) {
                        pcVar29 = "%s: script not found: %s\n";
                        goto LAB_0010b7fe;
                      }
                      goto LAB_0010b7b1;
                    }
                    if ((iVar7 != 0x66) && (iVar7 != 0x53)) break;
                    *(undefined4 *)((long)data_00 + lVar9 + 8) =
                         *(undefined4 *)(*(long *)(piVar17 + 4) + 8);
                    goto LAB_0010b7bb;
                  }
                  bVar27 = bVar27 + 1;
                }
                list_append_new(local_110,data_00);
                thanm_instr_free(local_130);
              }
              list_free_nodes(local_120);
              plVar19 = (list_node_t *)&script->labels;
              while (plVar19 = plVar19->next, plVar19 != (list_node_t *)0x0) {
                pvVar14 = plVar19->data;
                free(*(void **)((long)pvVar14 + 8));
                free(pvVar14);
              }
              list_free_nodes(&script->labels);
              plVar32 = local_118;
              plVar19 = (list_node_t *)&script->vars;
              while (plVar19 = plVar19->next, plVar19 != (list_node_t *)0x0) {
                var_free((var_t *)plVar19->data);
              }
              list_free_nodes(&script->vars);
            }
          }
          reg_free_user();
          puVar26 = (undefined1 *)&local_b8;
          while (puVar26 = *(undefined1 **)puVar26, puVar26 != (undefined1 *)0x0) {
            pvVar14 = *(void **)((long)puVar26 + 0x10);
            free(*(void **)((long)pvVar14 + 8));
            free(pvVar14);
          }
          list_free_nodes(&local_b8);
          puVar26 = (undefined1 *)&local_a8;
          while (puVar26 = *(undefined1 **)puVar26, puVar26 != (undefined1 *)0x0) {
            pvVar14 = *(void **)((long)puVar26 + 0x10);
            free(*(void **)((long)pvVar14 + 8));
            free(pvVar14);
          }
          list_free_nodes(&local_a8);
          puVar26 = (undefined1 *)&local_c8;
          while (puVar26 = *(undefined1 **)puVar26, puVar26 != (undefined1 *)0x0) {
            puVar2 = *(undefined8 **)((long)puVar26 + 0x10);
            free((void *)*puVar2);
            thanm_param_free((thanm_param_t *)puVar2[1]);
          }
          list_free_nodes(&local_c8);
        }
        else {
          local_148 = (anm_archive_t *)0x0;
        }
      }
      if (local_160 != (FILE *)0x0) {
        fclose(local_160);
      }
      if (local_148 == (anm_archive_t *)0x0) goto LAB_0010b2a8;
      plVar19 = (list_node_t *)&local_148->entries;
      plVar25 = plVar19;
LAB_0010ad8b:
      plVar25 = plVar25->next;
      if (plVar25 != (list_node_t *)0x0) {
        plVar32 = (long *)plVar25->data;
        if (*(short *)(*plVar32 + 0x34) != 0) {
          pcVar15 = (char *)plVar32[4];
          if (pcVar15 == (char *)0x0) {
            pcVar15 = (char *)plVar32[2];
          }
          pFVar10 = fopen(pcVar15,"rb");
          if (uVar5 == 0x13) {
            if (pFVar10 != (FILE *)0x0) {
              fseek(pFVar10,0,2);
              uVar11 = ftell(pFVar10);
              fseek(pFVar10,0,0);
              uVar28 = (uint)uVar11;
              *(uint *)(plVar32[1] + 0xc) = uVar28;
              uVar11 = uVar11 & 0xffffffff;
              png = (byte *)malloc(uVar11);
              fread(png,1,uVar11,pFVar10);
              fclose(pFVar10);
              iVar7 = png_identify(png,uVar28);
              if (iVar7 == 0) {
                if ((10 < uVar28) &&
                   (((*(int *)png == -0x1f002701 && (iVar7 = bcmp(png + 6,"JFIF",5), iVar7 == 0)) ||
                    ((*(int *)png == -0x1e002701 && (iVar7 = bcmp(png + 6,"Exif",5), iVar7 == 0)))))
                   ) {
                  pbVar12 = png + uVar11;
                  pbVar22 = png;
                  do {
                    pvVar14 = memchr(pbVar22,0xff,(long)pbVar12 - (long)pbVar22);
                    if ((pvVar14 == (void *)0x0) ||
                       (pbVar22 = (byte *)((long)pvVar14 + 1), pbVar22 == pbVar12))
                    goto LAB_0010b313;
                  } while ((*pbVar22 | 2) != 0xc2);
                  if (8 < (ulong)((long)pbVar12 - (long)pvVar14)) {
                    uVar3 = *(ushort *)((long)pvVar14 + 7) << 8 |
                            *(ushort *)((long)pvVar14 + 7) >> 8;
                    pbVar22 = (byte *)((long)pvVar14 + 5);
                    pbVar12 = (byte *)((long)pvVar14 + 6);
                    goto LAB_0010af92;
                  }
                }
LAB_0010b313:
                fprintf(_stderr,
                        "%s: not a PNG or JPEG file. Image files must be encoded in PNG or JPEG for Touhou 19\n"
                        ,pcVar15);
                free(png);
                goto LAB_0010a8e9;
              }
              uVar3 = *(ushort *)(png + 0x12) << 8 | *(ushort *)(png + 0x12) >> 8;
              pbVar22 = png + 0x16;
              pbVar12 = png + 0x17;
LAB_0010af92:
              uVar21 = CONCAT11(*pbVar22,*pbVar12);
              plVar32[0xb] = (long)png;
LAB_0010afa6:
              lVar9 = *plVar32;
              if (*(int *)(lVar9 + 0xc) == 0xffff) {
                uVar28 = 1;
                do {
                  uVar6 = uVar28;
                  uVar28 = uVar6 * 2;
                } while (uVar6 < uVar3);
                *(uint *)(lVar9 + 0xc) = uVar6;
              }
              if (*(int *)(lVar9 + 0x10) == 0xffff) {
                uVar28 = 1;
                do {
                  uVar6 = uVar28;
                  uVar28 = uVar6 * 2;
                } while (uVar6 < uVar21);
                *(uint *)(lVar9 + 0x10) = uVar6;
              }
              if (*(short *)(lVar9 + 0x34) == 1) {
                lVar31 = plVar32[1];
                uVar1 = *(ushort *)(lVar31 + 6);
                if (uVar1 == 0xffff) {
                  uVar1 = *(ushort *)(lVar9 + 0x14);
                  *(ushort *)(lVar31 + 6) = uVar1;
                }
                uVar28 = (uint)*(ushort *)(lVar31 + 8);
                if (*(ushort *)(lVar31 + 8) == 0xffff) {
                  *(ushort *)(lVar31 + 8) = uVar3;
                  uVar28 = (uint)uVar3;
                }
                uVar3 = *(ushort *)(lVar31 + 10);
                if (*(ushort *)(lVar31 + 10) == 0xffff) {
                  *(ushort *)(lVar31 + 10) = uVar21;
                  uVar3 = uVar21;
                }
                if (*(int *)(lVar31 + 0xc) == 0xffff) {
                  uVar6 = format_Bpp((uint)uVar1);
                  *(uint *)(plVar32[1] + 0xc) = uVar6 * uVar3 * uVar28;
                }
              }
              goto LAB_0010ad8b;
            }
          }
          else if (pFVar10 != (FILE *)0x0) {
            sVar13 = fread(&anms,0x1c,1,pFVar10);
            if ((sVar13 == 1) && (iVar7 = png_identify((uint8_t *)&anms,0x1c), iVar7 != 0)) {
              fclose(pFVar10);
              uVar3 = local_f6 << 8 | local_f6 >> 8;
              uVar21 = uStack_f2 << 8 | uStack_f2 >> 8;
              goto LAB_0010afa6;
            }
            pcVar29 = "%s: not a PNG file\n";
            goto LAB_0010a8e2;
          }
          pcVar29 = "%s: could not open for reading\n";
          goto LAB_0010a8e2;
        }
        goto LAB_0010ad8b;
      }
      plVar25 = plVar19;
      if (option_unique_filenames == 0) {
        anm_build_name_lists(local_148);
      }
      while (plVar25 = plVar25->next, plVar25 != (list_node_t *)0x0) {
        plVar32 = (long *)plVar25->data;
        if ((*(short *)(*plVar32 + 0x34) != 0) && (plVar32[0xb] == 0)) {
          pvVar14 = calloc(1,(ulong)*(uint *)(plVar32[1] + 0xc));
          plVar32[0xb] = (long)pvVar14;
        }
      }
      while (plVar19 = plVar19->next, plVar19 != (list_node_t *)0x0) {
        paVar23 = (anm_entry_t *)plVar19->data;
        if (paVar23->processed == 0) {
          pcVar15 = paVar23->filename;
          if (pcVar15 == (char *)0x0) {
            pcVar15 = paVar23->name;
          }
          anm_replace(local_148,(FILE *)0x0,paVar23,pcVar15,uVar5);
        }
      }
      current_output = *argv;
      anm_write(local_148,current_output,uVar5);
LAB_0010b2a3:
      anm_free(local_148);
LAB_0010b2a8:
      exit(0);
    }
  }
  else if (iVar7 == 0x78) {
    if (0 < ind) {
      current_input = *argv;
      pFVar10 = fopen(current_input,"rb");
      if (pFVar10 != (FILE *)0x0) {
        local_148 = anm_read_file((FILE *)pFVar10,uVar5);
        fclose(pFVar10);
        if (option_unique_filenames == 0) {
          anm_build_name_lists(local_148);
        }
        plVar19 = (list_node_t *)&local_148->entries;
        if (iVar4 == 1) {
          iVar7 = 0;
          while (plVar19 = plVar19->next, plVar19 != (list_node_t *)0x0) {
            paVar23 = (anm_entry_t *)plVar19->data;
            if (paVar23->processed == 0) {
              pcVar15 = paVar23->name;
              current_output = pcVar15;
              if (option_verbose != 0) {
                fprintf(_stderr,"%s\n");
                pcVar15 = paVar23->name;
              }
              if (option_unique_filenames == 0) {
LAB_0010b0f6:
                pcVar29 = (char *)0x0;
              }
              else {
                pcVar15 = anm_make_unique_filename(pcVar15,*argv,iVar7);
                pcVar29 = pcVar15;
                if (pcVar15 == (char *)0x0) {
                  pcVar15 = paVar23->name;
                  goto LAB_0010b0f6;
                }
              }
              anm_extract(paVar23,pcVar15,uVar5);
              free(pcVar29);
            }
            iVar7 = iVar7 + 1;
          }
        }
        else {
          for (lVar31 = 1; lVar31 < lVar9; lVar31 = lVar31 + 1) {
            iVar7 = 0;
            plVar25 = plVar19;
            while (plVar25 = plVar25->next, plVar25 != (list_node_t *)0x0) {
              paVar23 = (anm_entry_t *)plVar25->data;
              if (paVar23->processed == 0) {
                pcVar15 = paVar23->name;
                iVar4 = strcmp(argv[lVar31],pcVar15);
                if (iVar4 == 0) {
                  current_output = pcVar15;
                  if (option_verbose != 0) {
                    fprintf(_stderr,"%s\n",pcVar15);
                    pcVar15 = paVar23->name;
                  }
                  if (option_unique_filenames == 0) {
LAB_0010b215:
                    pcVar29 = (char *)0x0;
                  }
                  else {
                    pcVar15 = anm_make_unique_filename(pcVar15,*argv,iVar7);
                    pcVar29 = pcVar15;
                    if (pcVar15 == (char *)0x0) {
                      pcVar15 = paVar23->name;
                      goto LAB_0010b215;
                    }
                  }
                  anm_extract(paVar23,pcVar15,uVar5);
                  free(pcVar29);
                }
              }
              iVar7 = iVar7 + 1;
            }
            fprintf(_stderr,"%s:%s: %s not found in archive\n",argv0,current_input,argv[lVar31]);
          }
        }
        goto LAB_0010b2a3;
      }
      goto LAB_0010b17d;
    }
  }
  else if (iVar7 == 0x72) {
    if (ind == 3) {
      if (uVar5 == 0x13) {
        pcVar29 = "%s: -r doesn\'t work with th19\n";
        goto LAB_0010a8e2;
      }
      current_output = argv[2];
      current_input = *argv;
      pFVar10 = fopen(current_input,"rb");
      if (pFVar10 != (FILE *)0x0) {
        local_148 = anm_read_file((FILE *)pFVar10,uVar5);
        fclose(pFVar10);
        pFVar16 = fopen(*argv,"rb+");
        pFVar10 = _stderr;
        pcVar15 = current_input;
        pcVar29 = argv0;
        if (pFVar16 == (FILE *)0x0) {
          piVar17 = __errno_location();
          pcVar18 = strerror(*piVar17);
          __format = "%s: couldn\'t open %s for writing: %s\n";
          goto LAB_0010aa8f;
        }
        anm_build_name_lists(local_148);
        plVar19 = (list_node_t *)&local_148->names;
        do {
          plVar19 = plVar19->next;
          if (plVar19 == (list_node_t *)0x0) {
            fprintf(_stderr,"%s:%s: %s not found in archive\n",argv0,current_input,argv[1]);
            goto LAB_0010b3b9;
          }
          pcVar15 = (char *)plVar19->data;
          iVar7 = strcmp(argv[1],pcVar15);
        } while (iVar7 != 0);
        plVar19 = (list_node_t *)&local_148->entries;
        do {
          plVar19 = plVar19->next;
          if (plVar19 == (list_node_t *)0x0) {
            paVar23 = (anm_entry_t *)0x0;
            break;
          }
          paVar23 = (anm_entry_t *)plVar19->data;
        } while (paVar23->name != pcVar15);
        anm_replace(local_148,(FILE *)pFVar16,paVar23,argv[2],uVar5);
LAB_0010b3b9:
        fclose(pFVar16);
        goto LAB_0010b2a3;
      }
      goto LAB_0010b17d;
    }
  }
  else if ((iVar7 == 0x6c) && (ind == 1)) {
    current_input = *argv;
    pFVar10 = fopen(current_input,"rb");
    if (pFVar10 != (FILE *)0x0) {
      local_148 = anm_read_file((FILE *)pFVar10,uVar5);
      fclose(pFVar10);
      anm_dump(_stdout,local_148,uVar5,*argv);
      goto LAB_0010b2a3;
    }
LAB_0010b17d:
    fprintf(_stderr,"%s: couldn\'t open %s for reading\n",argv0,current_input);
    goto LAB_0010a8e9;
  }
LAB_0010a913:
  print_usage();
LAB_0010a8e9:
  exit(1);
switchD_0010a62a_caseD_76:
  option_verbose = option_verbose + 1;
  goto LAB_0010a5f1;
}

Assistant:

int
main(
    int argc,
    char* argv[])
{
    g_anmmap = anmmap_new();
    atexit(free_globals);

    const char commands[] = ":l:om:"
#ifdef HAVE_LIBPNG
                            "x:X:r:c:s:"
#endif
                            "Vfuv";
    int command = -1;

    FILE* in;
    unsigned version = 0;

    anm_archive_t* anm;
#ifdef HAVE_LIBPNG
    anm_entry_t* entry;
    char* name;

    FILE* anmfp;
    FILE* symbolfp = NULL;
    int i;
#endif

    argv0 = util_shortname(argv[0]);
    int opt;
    int ind = 0;
    while(argv[util_optind]) {
        switch(opt = util_getopt(argc,argv,commands)) {
        case 'c':
            if (option_print_offsets) {
                fprintf(stderr, "%s: 'o' option can't be used when creating ANM archive\n", argv0);
                exit(1);
            }
            /* fallthrough */
        case 'l':
        case 'x':
        case 'X':
        case 'r':
            if(command != -1) {
                fprintf(stderr,"%s: More than one mode specified\n",argv0);
                print_usage();
                exit(1);
            }
            command = opt;
            version = parse_version(util_optarg);
            break;
        case 'm': {
            FILE* map_file = NULL;
            map_file = fopen(util_optarg, "r");
            if (!map_file) {
                fprintf(stderr, "%s: couldn't open %s for reading: %s\n",
                    argv0, util_optarg, strerror(errno));
            } else {
                anmmap_load(g_anmmap, map_file, util_optarg);
                fclose(map_file);
            }
            break;
        }
        case 's':
            symbolfp = fopen(util_optarg, "w");
            if (!symbolfp) {
                fprintf(stderr, "%s: couldn't open %s for writing: %s\n",
                    argv0, util_optarg, strerror(errno));
            }
            break;
        case 'f':
            option_force = 1;
            break;
        case 'u':
            if (option_unique_filenames)
                option_dont_add_offset_border = 1;
            else
                option_unique_filenames = 1;
            break;
        case 'v':
            option_verbose++;
            break;
        case 'o':
            if (command == 'c') {
                fprintf(stderr, "%s: 'o' option can't be used when creating ANM archive\n", argv0);
                exit(1);
            }
            option_print_offsets = 1;
            break;
        default:
            util_getopt_default(&ind,argv,opt,print_usage);
        }
    }
    argc = ind;
    argv[argc] = NULL;

    if (command == -1) {
        print_usage();
        exit(1);
    }

    switch (version) {
    case 6:
    case 7:
    case 8:
    case 9:
    case 95:
    case 10:
    case 103:
    case 11:
    case 125:
    case 128:
    case 12:
    case 13:
    case 143:
    case 14:
    case 15:
    case 165:
    case 16:
    case 17:
    case 185:
    case 18:
    case 19:
    /* NEWHU: 19 */
        break;
    default:
        if (version == 0)
            fprintf(stderr, "%s: version must be specified\n", argv0);
        else
            fprintf(stderr, "%s: version %u is unsupported\n", argv0, version);
        exit(1);
    }

    switch (command) {
    case 'l':
        if (argc != 1) {
            print_usage();
            exit(1);
        }

        current_input = argv[0];
        in = fopen(argv[0], "rb");
        if (!in) {
            fprintf(stderr, "%s: couldn't open %s for reading\n", argv0, current_input);
            exit(1);
        }
        anm = anm_read_file(in, version);
        fclose(in);
        anm_dump(stdout, anm, version, argv[0]);

        anm_free(anm);
        exit(0);
#ifdef HAVE_LIBPNG
    case 'x':
        if (argc < 1) {
            print_usage();
            exit(1);
        }

        current_input = argv[0];
        in = fopen(argv[0], "rb");
        if (!in) {
            fprintf(stderr, "%s: couldn't open %s for reading\n", argv0, current_input);
            exit(1);
        }
        anm = anm_read_file(in, version);
        fclose(in);

        if (!option_unique_filenames)
            anm_build_name_lists(anm);

        if (argc == 1) {
            /* Extract all files. */
            int j = 0;
            list_for_each(&anm->entries, entry) {
                if (!entry->processed) {
                    char *filename = 0;
                    current_output = entry->name;
                    if (option_verbose >= 1)
                        fprintf(stderr, "%s\n", entry->name);
                    if (option_unique_filenames)
                        filename = anm_make_unique_filename(entry->name, argv[0], j);
                    anm_extract(entry, filename ? filename : entry->name, version);
                    free(filename);
                }
                j++;
            }
        } else {
            /* Extract all listed files. */
            for (i = 1; i < argc; ++i) {
                int j = 0;
                list_for_each(&anm->entries, entry) {
                    if (!entry->processed) {
                        if (strcmp(argv[i], entry->name) == 0) {
                            char *filename = 0;
                            current_output = entry->name;
                            if (option_verbose >= 1)
                                fprintf(stderr, "%s\n", entry->name);
                            if (option_unique_filenames)
                                filename = anm_make_unique_filename(entry->name, argv[0], j);
                            anm_extract(entry, filename ? filename : entry->name, version);
                            free(filename);
                            /* unfortunately we can't just skip to next argv, because of possible duplicates */
                        }
                    }
                    j++;
                }
                fprintf(stderr, "%s:%s: %s not found in archive\n",
                    argv0, current_input, argv[i]);
            }
        }

        anm_free(anm);
        exit(0);
    case 'X': {
        list_t anms;
        list_init(&anms);

        if (argc < 1) {
            print_usage();
            exit(1);
        }

        for (i = 0; i < argc; ++i) {
            current_input = argv[i];
            in = fopen(argv[i], "rb");
            if (!in) {
                fprintf(stderr, "%s: couldn't open %s for reading\n", argv0, current_input);
                exit(1);
            }
            anm = anm_read_file(in, version);
            list_append_new(&anms, anm);
            fclose(in);
        }

        anm_build_name_lists_multiple(&anms);

        i = 0;
        list_for_each(&anms, anm) {
            int j = 0;
            list_for_each(&anm->entries, entry) {
                if (!entry->processed) {
                    char *filename = 0;
                    current_output = entry->name;
                    if (option_verbose >= 1)
                        fprintf(stderr, "%s\n", entry->name);
                    if (option_unique_filenames)
                        filename = anm_make_unique_filename(entry->name, argv[i], j);
                    anm_extract(entry, filename ? filename : entry->name, version);
                    free(filename);
                }
                j++;
            }
            i++;
        }

        list_for_each(&anms, anm)
            anm_free(anm);
        list_free_nodes(&anms);
        exit(0);
    }
    case 'r':
        if (argc != 3) {
            print_usage();
            exit(1);
        }

        if (version == 19) {
            /* NEWHU: 19 */ /* FIXME: */
            fprintf(stderr, "%s: -r doesn't work with th19\n", argv0);
            exit(1);
        }

        current_output = argv[2];
        current_input = argv[0];
        in = fopen(argv[0], "rb");
        if (!in) {
            fprintf(stderr, "%s: couldn't open %s for reading\n", argv0, current_input);
            exit(1);
        }
        anm = anm_read_file(in, version);
        fclose(in);

        anmfp = fopen(argv[0], "rb+");
        if (!anmfp) {
            fprintf(stderr, "%s: couldn't open %s for writing: %s\n",
                argv0, current_input, strerror(errno));
            exit(1);
        }

        anm_build_name_lists(anm);
        list_for_each(&anm->names, name) {
            if (strcmp(argv[1], name) == 0) {
                anm_replace(anm, anmfp, util_entry_by_name(anm, name), argv[2], version);
                goto replace_done;
            }
        }

        fprintf(stderr, "%s:%s: %s not found in archive\n",
            argv0, current_input, argv[1]);

replace_done:

        fclose(anmfp);

#if 0
        offset = 0;
        list_for_each(&anm->entries, entry) {
            unsigned int nextoffset = entry->header->nextoffset;
            if (strcmp(argv[1], entry->name) == 0 && entry->header->hasdata) {
                if (!file_seek(anmfp,
                    offset + entry->header->thtxoffset + 4 + sizeof(thtx_header_t)))
                    exit(1);
                if (!file_write(anmfp, entry->data, entry->thtx->size))
                    exit(1);
            }
            offset += nextoffset;
        }
#endif

        anm_free(anm);
        exit(0);
    case 'c':
        if (argc != 2) {
            print_usage();
            exit(1);
        }
        current_input = argv[1];
        anm = anm_create(argv[1], symbolfp, version);

        if (symbolfp)
            fclose(symbolfp);

        if (anm == NULL)
            exit(0);

        anm_defaults(anm, version);

        /* Allocate enough space for the THTX data. */
        if (!option_unique_filenames)
            anm_build_name_lists(anm);
        list_for_each(&anm->entries, entry) {
            if (entry->header->hasdata && !entry->data) {
                /* XXX: There are a few entries with a thtx.size greater than
                 *      w*h*Bpp.  The extra data appears to be all zeroes. */
                entry->data = calloc(1, entry->thtx->size);
            }
        }
        list_for_each(&anm->entries, entry) {
            if (!entry->processed)
                anm_replace(anm, NULL, entry, entry->filename ? entry->filename : entry->name, version);
        }

        current_output = argv[0];
        anm_write(anm, argv[0], version);

        anm_free(anm);
        exit(0);
#endif
    default:
        print_usage();
        exit(1);
    }
}